

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::CreateBoundStructExtractIndex
          (duckdb *this,ClientContext *context,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          idx_t key)

{
  pointer pBVar1;
  pointer *__ptr;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  LogicalType return_type;
  ScalarFunction extract_function;
  __uniq_ptr_impl<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>_>
  local_1c8;
  undefined1 local_1c0 [8];
  string local_1b8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [2];
  LogicalType local_158;
  ScalarFunction local_140;
  
  local_198.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&local_198,expr);
  Value::BIGINT((Value *)&local_140,key);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
            ((duckdb *)(local_1c0 + 8),(Value *)&local_140);
  local_178[0]._0_8_ = local_1b8._M_dataplus._M_p;
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&local_198,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_178[0]._M_allocated_capacity);
  if ((long *)local_178[0]._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_178[0]._0_8_ + 8))();
  }
  local_178[0]._M_allocated_capacity = 0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_1b8._M_dataplus._M_p)[1])();
  }
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  Value::~Value((Value *)&local_140);
  GetIndexExtractFunction();
  (*local_140.bind)((ClientContext *)local_1c0,(ScalarFunction *)context,
                    (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     *)&local_140);
  LogicalType::LogicalType(&local_158,&local_140.super_BaseScalarFunction.return_type);
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&local_1c8,&local_158,&local_140,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_198,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             local_1c0);
  pBVar1 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                         *)&local_1c8);
  ::std::__cxx11::to_string((string *)(local_1c0 + 8),key);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   "element",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1c0 + 8));
  ::std::__cxx11::string::operator=
            ((string *)&(pBVar1->super_Expression).super_BaseExpression.alias,
             (string *)local_178[0]._M_local_buf);
  ::std::__cxx11::string::~string((string *)local_178[0]._M_local_buf);
  ::std::__cxx11::string::~string((string *)(local_1c0 + 8));
  *(tuple<duckdb::BoundFunctionExpression_*,_std::default_delete<duckdb::BoundFunctionExpression>_>
    *)this = local_1c8._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundFunctionExpression_*,_std::default_delete<duckdb::BoundFunctionExpression>_>
             .super__Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false>._M_head_impl;
  LogicalType::~LogicalType(&local_158);
  if ((_Head_base<0UL,_duckdb::FunctionData_*,_false>)local_1c0 !=
      (_Head_base<0UL,_duckdb::FunctionData_*,_false>)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_1c0)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ScalarFunction::~ScalarFunction(&local_140);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_198);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> CreateBoundStructExtractIndex(ClientContext &context, unique_ptr<Expression> expr, idx_t key) {
	vector<unique_ptr<Expression>> arguments;
	arguments.push_back(std::move(expr));
	arguments.push_back(make_uniq<BoundConstantExpression>(Value::BIGINT(int64_t(key))));
	auto extract_function = GetIndexExtractFunction();
	auto bind_info = extract_function.bind(context, extract_function, arguments);
	auto return_type = extract_function.return_type;
	auto result = make_uniq<BoundFunctionExpression>(return_type, std::move(extract_function), std::move(arguments),
	                                                 std::move(bind_info));
	result->SetAlias("element" + to_string(key));
	return std::move(result);
}